

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::SetMotorCurrent(AmpIO *this,uint index,uint32_t sdata)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = this->NumMotors;
  if (index < uVar1) {
    uVar5 = (sdata & 0xffff) + 0x80000000;
    if ((this->collect_state == true) && (index + 1 == (uint)this->collect_chan)) {
      uVar5 = sdata & 0xffff | 0xc0000000;
    }
    uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar2 < 8) {
      uVar3 = ((this->super_FpgaIO).super_BoardIO.BoardId & 0xf) << 0x18;
      uVar4 = (ulong)(this->WB_CURR_OFFSET + index);
    }
    else {
      uVar4 = (ulong)(this->WB_CURR_OFFSET + index);
      uVar3 = this->WriteBuffer[uVar4] & 0x30000000;
    }
    this->WriteBuffer[uVar4] = uVar3 | uVar5;
  }
  return index < uVar1;
}

Assistant:

bool AmpIO::SetMotorCurrent(unsigned int index, uint32_t sdata)
{
    if (index >= NumMotors)
        return false;

    quadlet_t data = VALID_BIT | (sdata & DAC_MASK);
    if (collect_state && (collect_chan == (index+1)))
        data |= COLLECT_BIT;
    if (GetFirmwareVersion() < 8) {
        data |= ((BoardId & 0x0F) << 24);
    }
    else {
        // Preserve any motor enable bits set by SetAmpEnable
        data |= WriteBuffer[WB_CURR_OFFSET+index]&(MOTOR_ENABLE_MASK|MOTOR_ENABLE_BIT);
    }
    WriteBuffer[WB_CURR_OFFSET+index] = data;
    return true;
}